

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandCollapse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  uint fVerbose;
  int iVar5;
  uint fDualRail;
  uint fReorder;
  uint local_48;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fReorder = 1;
  local_48 = 1000000000;
  fDualRail = 0;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Brdvh"), iVar5 = globalUtilOptind, iVar1 == 0x72) {
        fReorder = fReorder ^ 1;
      }
      if (iVar1 < 100) break;
      if (iVar1 == 100) {
        fDualRail = fDualRail ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_00203d03;
        fVerbose = fVerbose ^ 1;
      }
    }
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else {
        if (pAVar2->ntkType == ABC_NTK_LOGIC) {
          pNtk = Abc_NtkStrash(pAVar2,0,0,0);
          pAVar2 = Abc_NtkCollapse(pNtk,local_48,fDualRail,fReorder,fVerbose);
          Abc_NtkDelete(pNtk);
        }
        else {
          if (pAVar2->ntkType != ABC_NTK_STRASH) {
            pcVar3 = "Can only collapse a logic network or an AIG.\n";
            goto LAB_00203cde;
          }
          pAVar2 = Abc_NtkCollapse(pAVar2,local_48,fDualRail,fReorder,fVerbose);
        }
        if (pAVar2 != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
          return 0;
        }
        pcVar3 = "Collapsing has failed.\n";
      }
LAB_00203cde:
      iVar5 = -1;
      goto LAB_00203daf;
    }
    if (iVar1 != 0x42) goto LAB_00203d03;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
      goto LAB_00203d03;
    }
    local_48 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)local_48 < 0) {
LAB_00203d03:
      Abc_Print(-2,"usage: collapse [-B <num>] [-rdvh]\n");
      Abc_Print(-2,"\t          collapses the network by constructing global BDDs\n");
      Abc_Print(-2,"\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n",
                (ulong)local_48);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (fReorder == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r      : toggles dynamic variable reordering [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (fDualRail == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-d      : toggles dual-rail collapsing mode [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h      : print the command usage\n";
      iVar5 = -2;
LAB_00203daf:
      Abc_Print(iVar5,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCollapse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fVerbose;
    int fBddSizeMax;
    int fDualRail;
    int fReorder;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fVerbose = 0;
    fReorder = 1;
    fDualRail = 0;
    fBddSizeMax = ABC_INFINITY;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Brdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            fBddSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( fBddSizeMax < 0 )
                goto usage;
            break;
        case 'd':
            fDualRail ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'r':
            fReorder ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only collapse a logic network or an AIG.\n" );
        return 1;
    }

    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Collapsing has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: collapse [-B <num>] [-rdvh]\n" );
    Abc_Print( -2, "\t          collapses the network by constructing global BDDs\n" );
    Abc_Print( -2, "\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n", fBddSizeMax );
    Abc_Print( -2, "\t-r      : toggles dynamic variable reordering [default = %s]\n", fReorder? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dual-rail collapsing mode [default = %s]\n", fDualRail? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}